

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O1

float sensitivity(ftrl *b,base_learner *param_2,example *ec)

{
  vw *pvVar1;
  uncertainty local_10;
  
  local_10.pred = 0.0;
  local_10.score = 0.0;
  pvVar1 = b->all;
  local_10.b = b;
  if ((pvVar1->weights).sparse == true) {
    GD::foreach_feature<uncertainty,_float_&,_&predict_with_confidence,_sparse_parameters>
              (&(pvVar1->weights).sparse_weights,pvVar1->ignore_some_linear,pvVar1->ignore_linear,
               &pvVar1->interactions,pvVar1->permutations,&ec->super_example_predict,&local_10);
  }
  else {
    GD::foreach_feature<uncertainty,_float_&,_&predict_with_confidence,_dense_parameters>
              (&(pvVar1->weights).dense_weights,pvVar1->ignore_some_linear,pvVar1->ignore_linear,
               &pvVar1->interactions,pvVar1->permutations,&ec->super_example_predict,&local_10);
  }
  return local_10.score;
}

Assistant:

float sensitivity(ftrl& b, base_learner& /* base */, example& ec)
{
  uncertainty uncetain(b);
  GD::foreach_feature<uncertainty, predict_with_confidence>(*(b.all), ec, uncetain);
  return uncetain.score;
}